

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall VCWinDeployQtTool::~VCWinDeployQtTool(VCWinDeployQtTool *this)

{
  VCWinDeployQtTool *in_RDI;
  
  ~VCWinDeployQtTool(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

VCWinDeployQtTool() {}